

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O2

bool ASDCP::MXF::GetEditRateFromFP(OP1aHeader *header,Rational *edit_rate)

{
  Rational RVar1;
  InterchangeObject *pIVar2;
  int iVar3;
  Dictionary *pDVar4;
  MDDEntry *pMVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  undefined4 extraout_var;
  ILogSink *pIVar10;
  char *pcVar11;
  UUID *pUVar12;
  undefined4 uVar13;
  char *pcVar14;
  bool bVar15;
  InterchangeObject *temp_item;
  UUID *local_180;
  Rational *local_178;
  ulong local_170;
  undefined4 local_164;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> temp_items
  ;
  char buf [64];
  Result_t result;
  Result_t local_98 [104];
  
  temp_items.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&temp_items;
  temp_items.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node._M_size = 0;
  temp_items.
  super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       temp_items.
       super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  pDVar4 = DefaultCompositeDict();
  pMVar5 = Dictionary::Type(pDVar4,MDD_SourcePackage);
  (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x16])
            (&result,header,pMVar5,&temp_items);
  if (_result < 0) {
    pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar10,"The MXF header does not contain a FilePackage item.\n");
    uVar13 = 0;
  }
  else if (temp_items.
           super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
           ._M_impl._M_node._M_size == 1) {
    local_178 = edit_rate;
    if ((temp_items.
         super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
         ._M_impl._M_node.super__List_node_base._M_next[1]._M_next == (_List_node_base *)0x0) ||
       (lVar6 = __dynamic_cast(temp_items.
                               super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                               ._M_impl._M_node.super__List_node_base._M_next[1]._M_next,
                               &InterchangeObject::typeinfo,&SourcePackage::typeinfo,0), lVar6 == 0)
       ) {
      __assert_fail("source_package",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                    ,0x7e1,
                    "bool ASDCP::MXF::GetEditRateFromFP(ASDCP::MXF::OP1aHeader &, ASDCP::Rational &)"
                   );
    }
    pUVar12 = *(UUID **)(lVar6 + 0x138);
    local_170 = 0;
    while (bVar15 = pUVar12 == *(UUID **)(lVar6 + 0x140),
          local_164 = (undefined4)CONCAT71((int7)((ulong)lVar6 >> 8),bVar15), uVar13 = local_164,
          !bVar15) {
      local_180 = pUVar12;
      (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                (local_98,header,pUVar12,&temp_item);
      Kumu::Result_t::operator=(&result,local_98);
      Kumu::Result_t::~Result_t(local_98);
      if (_result < 0) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = Kumu::UUID::EncodeHex(local_180,buf,0x40);
        Kumu::ILogSink::Error
                  (pIVar10,"The MXF header is incomplete: strong reference %s leads nowhere.\n",
                   pcVar11);
        uVar13 = local_164;
        break;
      }
      if ((temp_item == (InterchangeObject *)0x0) ||
         (lVar7 = __dynamic_cast(temp_item,&InterchangeObject::typeinfo,&Track::typeinfo,0),
         lVar7 == 0)) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = Kumu::UUID::EncodeHex(local_180,buf,0x40);
        pcVar14 = "The MXF header is incomplete: %s is not a Track item.\n";
LAB_0019cfbc:
        Kumu::ILogSink::Error(pIVar10,pcVar14,pcVar11);
        uVar13 = local_164;
        break;
      }
      (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                (local_98,header,(UUID *)(lVar7 + 0xd8),&temp_item);
      Kumu::Result_t::operator=(&result,local_98);
      Kumu::Result_t::~Result_t(local_98);
      if (_result < 0) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = Kumu::UUID::EncodeHex(local_180,buf,0x40);
        pcVar14 = "The MXF header is incomplete: strong reference %s leads nowhere.\n";
        goto LAB_0019cfbc;
      }
      if ((temp_item == (InterchangeObject *)0x0) ||
         (lVar8 = __dynamic_cast(temp_item,&InterchangeObject::typeinfo,&Sequence::typeinfo,0),
         lVar8 == 0)) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = Kumu::UUID::EncodeHex((UUID *)(lVar7 + 0xd8),buf,0x40);
        pcVar14 = "The MXF header is incomplete: %s is not a Sequence item.\n";
        goto LAB_0019d06e;
      }
      if (*(long *)(lVar8 + 0xe0) - *(long *)(lVar8 + 0xd8) != 0x20) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Error
                  (pIVar10,
                   "The Sequence item must contain one reference to an esence item, found %d.\n",
                   *(long *)(lVar8 + 0xe0) - *(long *)(lVar8 + 0xd8) >> 5);
        uVar13 = local_164;
        break;
      }
      (*(header->super_Partition).super_KLVFilePacket.super_KLVPacket._vptr_KLVPacket[0x13])
                (local_98,header,*(long *)(lVar8 + 0xd8),&temp_item);
      Kumu::Result_t::operator=(&result,local_98);
      Kumu::Result_t::~Result_t(local_98);
      pIVar2 = temp_item;
      if (_result < 0) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = Kumu::UUID::EncodeHex(*(UUID **)(lVar8 + 0xd8),buf,0x40);
        pcVar14 = "The MXF header is incomplete: strong reference %s leads nowhere.\n";
LAB_0019d06e:
        Kumu::ILogSink::Error(pIVar10,pcVar14,pcVar11);
        uVar13 = local_164;
        break;
      }
      pDVar4 = DefaultCompositeDict();
      pMVar5 = Dictionary::Type(pDVar4,MDD_SourceClip);
      iVar3 = (*(pIVar2->super_KLVPacket)._vptr_KLVPacket[0xf])(pIVar2,pMVar5);
      pIVar2 = temp_item;
      if ((char)iVar3 == '\0') {
        pDVar4 = DefaultCompositeDict();
        pMVar5 = Dictionary::Type(pDVar4,MDD_TimecodeComponent);
        iVar3 = (*(pIVar2->super_KLVPacket)._vptr_KLVPacket[0xf])(pIVar2,pMVar5);
        if ((char)iVar3 != '\0') goto LAB_0019ced1;
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        iVar3 = (*(temp_item->super_KLVPacket)._vptr_KLVPacket[0x10])();
        pcVar11 = (char *)CONCAT44(extraout_var,iVar3);
        pcVar14 = "Reference from Sequence to an unexpected type: %s.\n";
        goto LAB_0019d06e;
      }
      if ((temp_item == (InterchangeObject *)0x0) ||
         (lVar9 = __dynamic_cast(temp_item,&InterchangeObject::typeinfo,&SourceClip::typeinfo,0),
         lVar9 == 0)) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = Kumu::UUID::EncodeHex(*(UUID **)(lVar8 + 0xd8),buf,0x40);
        pcVar14 = "The MXF header is incomplete: %s is not a SourceClip item.\n";
LAB_0019d043:
        Kumu::ILogSink::Error(pIVar10,pcVar14,pcVar11);
        uVar13 = local_164;
        break;
      }
      if ((local_170 & 1) == 0) {
        RVar1 = *(Rational *)(lVar7 + 0x108);
        *local_178 = RVar1;
        local_170 = CONCAT71(RVar1._1_7_,1);
      }
      else if ((*(int *)(lVar7 + 0x108) != local_178->Numerator) ||
              (local_170 = CONCAT71((int7)((ulong)local_178 >> 8),1),
              *(int *)(lVar7 + 0x10c) != local_178->Denominator)) {
        pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
        pcVar11 = Kumu::UUID::EncodeHex(*(UUID **)(lVar8 + 0xd8),buf,0x40);
        pcVar14 = 
        "The MXF header is incomplete: %s EditRate value does not match others in the file.\n";
        goto LAB_0019d043;
      }
LAB_0019ced1:
      pUVar12 = local_180 + 1;
    }
  }
  else {
    pIVar10 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar10,"The MXF header must contain one FilePackage item, found %d.\n",
               temp_items.
               super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
               ._M_impl._M_node._M_size);
    uVar13 = 0;
  }
  Kumu::Result_t::~Result_t(&result);
  std::__cxx11::
  _List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
  _M_clear(&temp_items.
            super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
          );
  return SUB41(uVar13,0);
}

Assistant:

bool
ASDCP::MXF::GetEditRateFromFP(ASDCP::MXF::OP1aHeader& header, ASDCP::Rational& edit_rate)
{
  bool has_first_item = false;

  MXF::InterchangeObject* temp_item;
  std::list<MXF::InterchangeObject*> temp_items;

  Result_t result = header.GetMDObjectsByType(DefaultCompositeDict().ul(MDD_SourcePackage), temp_items);

  if ( KM_FAILURE(result) )
    {
      DefaultLogSink().Error("The MXF header does not contain a FilePackage item.\n");
      return false;
    }

  if ( temp_items.size() != 1 )
    {
      DefaultLogSink().Error("The MXF header must contain one FilePackage item, found %d.\n", temp_items.size());
      return false;
    }

  char buf[64];
  MXF::Array<UUID>::const_iterator i;
  MXF::SourcePackage *source_package = dynamic_cast<MXF::SourcePackage*>(temp_items.front());
  assert(source_package);

  for ( i = source_package->Tracks.begin(); i != source_package->Tracks.end(); ++i )
    {
      // Track
      result = header.GetMDObjectByID(*i, &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      MXF::Track *track = dynamic_cast<MXF::Track*>(temp_item);

      if ( track == 0 )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: %s is not a Track item.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      // Sequence
      result = header.GetMDObjectByID(track->Sequence, &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 i->EncodeHex(buf, 64));
	  return false;
	}

      MXF::Sequence *sequence = dynamic_cast<MXF::Sequence*>(temp_item);

      if ( sequence == 0 )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: %s is not a Sequence item.\n",
				 track->Sequence.get().EncodeHex(buf, 64));
	  return false;
	}

      if ( sequence->StructuralComponents.size() != 1 )
	{
	  DefaultLogSink().Error("The Sequence item must contain one reference to an esence item, found %d.\n",
				 sequence->StructuralComponents.size());
	  return false;
	}

      // SourceClip
      result = header.GetMDObjectByID(sequence->StructuralComponents.front(), &temp_item);

      if ( KM_FAILURE(result) )
	{
	  DefaultLogSink().Error("The MXF header is incomplete: strong reference %s leads nowhere.\n",
				 sequence->StructuralComponents.front().EncodeHex(buf, 64));
	  return false;
	}

      if ( temp_item->IsA(DefaultCompositeDict().ul(MDD_SourceClip)) )
	{
	  MXF::SourceClip *source_clip = dynamic_cast<MXF::SourceClip*>(temp_item);

	  if ( source_clip == 0 )
	    {
	      DefaultLogSink().Error("The MXF header is incomplete: %s is not a SourceClip item.\n",
				     sequence->StructuralComponents.front().EncodeHex(buf, 64));
	      return false;
	    }

	  if ( ! has_first_item )
	    {
	      edit_rate = track->EditRate;
	      has_first_item = true;
	    }
	  else if ( edit_rate != track->EditRate )
	    {
	      DefaultLogSink().Error("The MXF header is incomplete: %s EditRate value does not match others in the file.\n",
				     sequence->StructuralComponents.front().EncodeHex(buf, 64));
	      return false;
	    }
	}
      else if ( ! temp_item->IsA(DefaultCompositeDict().ul(MDD_TimecodeComponent)) )
	{
	  DefaultLogSink().Error("Reference from Sequence to an unexpected type: %s.\n", temp_item->ObjectName());
	  return false;
	}
    }

  return true;
}